

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

void __thiscall
QMdi::RegularTiler::rearrange(RegularTiler *this,QList<QWidget_*> *widgets,QRect *domain)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  QWidget *this_00;
  bool bVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  LayoutDirection direction;
  int iVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int col;
  int iVar17;
  int index;
  long in_FS_OFFSET;
  double dVar18;
  QRect local_58;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = (widgets->d).size;
  if (uVar3 != 0) {
    dVar18 = (double)(int)uVar3;
    if (dVar18 < 0.0) {
      dVar18 = sqrt(dVar18);
    }
    else {
      dVar18 = SQRT(dVar18);
    }
    dVar18 = ceil(dVar18);
    iVar14 = (int)dVar18;
    if (iVar14 < 2) {
      iVar14 = 1;
    }
    uVar3 = (ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff;
    iVar10 = (int)((long)uVar3 % (long)iVar14);
    iVar8 = ((int)((long)uVar3 / (long)iVar14) + 1) - (uint)(iVar10 == 0);
    iVar15 = 1;
    if (1 < iVar8) {
      iVar15 = iVar8;
    }
    iVar6 = (((domain->x2).m_i - (domain->x1).m_i) + 1) / iVar14;
    iVar5 = (((domain->y2).m_i - (domain->y1).m_i) + 1) / iVar15;
    index = 0;
    for (iVar11 = 0; this = (RegularTiler *)(ulong)(uint)-iVar14, iVar11 != iVar15;
        iVar11 = iVar11 + 1) {
      iVar16 = iVar11 * (iVar5 + 1);
      iVar9 = iVar5 + iVar16;
      iVar13 = 0;
      for (iVar17 = 0; iVar17 != iVar14; iVar17 = iVar17 + 1) {
        bVar4 = iVar14 - iVar10 <= iVar17;
        if ((iVar11 != 1) || (bVar4 || iVar10 == 0)) {
          iVar1 = (domain->x2).m_i;
          iVar2 = (domain->y2).m_i;
          bVar7 = sanityCheck(widgets,index,"RegularTiler");
          if (bVar7) {
            local_48.y2.m_i = iVar5 * 2 + 1;
            if (iVar8 == 2) {
              local_48.y2.m_i = iVar2;
            }
            if (bVar4 || iVar10 == 0) {
              local_48.y2.m_i = iVar9;
            }
            if (iVar11 != 0) {
              local_48.y2.m_i = iVar9;
            }
            if (iVar11 == iVar15 + -1) {
              local_48.y2.m_i = iVar2;
            }
            local_48.x2.m_i = iVar6 + iVar13;
            if (-iVar14 + iVar17 == -1) {
              local_48.x2.m_i = iVar1;
            }
            lVar12 = (long)index;
            index = index + 1;
            this_00 = (widgets->d).ptr[lVar12];
            local_48.x1.m_i = iVar13;
            local_48.y1.m_i = iVar16;
            direction = QWidget::layoutDirection(this_00);
            local_58 = QStyle::visualRect(direction,domain,&local_48);
            QWidget::setGeometry(this_00,&local_58);
          }
        }
        iVar13 = iVar13 + iVar6 + 1;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail(this);
  }
  return;
}

Assistant:

void RegularTiler::rearrange(QList<QWidget *> &widgets, const QRect &domain) const
{
    if (widgets.isEmpty())
        return;

    const int n = widgets.size();
    const int ncols = qMax(qCeil(qSqrt(qreal(n))), 1);
    const int nrows = qMax((n % ncols) ? (n / ncols + 1) : (n / ncols), 1);
    const int nspecial = (n % ncols) ? (ncols - n % ncols) : 0;
    const int dx = domain.width()  / ncols;
    const int dy = domain.height() / nrows;

    int i = 0;
    for (int row = 0; row < nrows; ++row) {
        const int y1 = int(row * (dy + 1));
        for (int col = 0; col < ncols; ++col) {
            if (row == 1 && col < nspecial)
                continue;
            const int x1 = int(col * (dx + 1));
            int x2 = int(x1 + dx);
            int y2 = int(y1 + dy);
            if (row == 0 && col < nspecial) {
                y2 *= 2;
                if (nrows != 2)
                    y2 += 1;
                else
                    y2 = domain.bottom();
            }
            if (col == ncols - 1 && x2 != domain.right())
                x2 = domain.right();
            if (row == nrows - 1 && y2 != domain.bottom())
                y2 = domain.bottom();
            if (!sanityCheck(widgets, i, "RegularTiler"))
                continue;
            QWidget *widget = widgets.at(i++);
            QRect newGeometry = QRect(QPoint(x1, y1), QPoint(x2, y2));
            widget->setGeometry(QStyle::visualRect(widget->layoutDirection(), domain, newGeometry));
        }
    }
}